

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

bool __thiscall helics::TimeDependencies::isDependency(TimeDependencies *this,GlobalFederateId ofed)

{
  DependencyInfo *pDVar1;
  undefined1 uVar2;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  _Var3;
  
  pDVar1 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  _Var3 = std::
          lower_bound<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::GlobalFederateId,helics::__0>
                    ((this->dependencies).
                     super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start,pDVar1);
  if ((_Var3._M_current == pDVar1) || (((_Var3._M_current)->fedID).gid != ofed.gid)) {
    uVar2 = 0;
  }
  else {
    uVar2 = (_Var3._M_current)->dependency;
  }
  return (bool)uVar2;
}

Assistant:

bool TimeDependencies::isDependency(GlobalFederateId ofed) const
{
    auto res = std::lower_bound(dependencies.begin(), dependencies.end(), ofed, dependencyCompare);
    if (res == dependencies.end()) {
        return false;
    }
    return (res->fedID == ofed) ? res->dependency : false;
}